

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  __type _Var1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  string *this;
  ostream *poVar5;
  iterator iVar6;
  long lVar7;
  long lVar8;
  int idx;
  string chosenString;
  string retValue;
  string retrieved;
  string retKey;
  string randomValue;
  string key;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  keyValueStore;
  string *stringPtrArray [65000];
  
  chosenString._M_dataplus._M_p = (pointer)&chosenString.field_2;
  chosenString._M_string_length = 0;
  chosenString.field_2._M_local_buf[0] = '\0';
  std::chrono::_V2::steady_clock::now();
  for (lVar7 = 0; lVar7 != 65000; lVar7 = lVar7 + 1) {
    pcVar4 = (char *)operator_new__(0x21);
    for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 1) {
      iVar2 = rand();
      pcVar4[lVar8] = (char)(iVar2 % 0x1a) + 'a';
    }
    pcVar4[0x20] = '\0';
    this = (string *)operator_new(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this,pcVar4,(allocator<char> *)&retKey);
    stringPtrArray[lVar7] = this;
    if (lVar7 == 0xbe6f) {
      std::__cxx11::string::_M_assign((string *)&chosenString);
    }
  }
  std::chrono::_V2::steady_clock::now();
  poVar5 = std::operator<<((ostream *)&std::cout,"Storage: Time difference = ");
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  poVar5 = std::operator<<(poVar5,"[ms]");
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"Storage: Time difference = ");
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  poVar5 = std::operator<<(poVar5,anon_var_dwarf_50de);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"Storage: Time difference = ");
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  poVar5 = std::operator<<(poVar5,"[ns]");
  std::endl<char,std::char_traits<char>>(poVar5);
  lVar7 = 0;
  std::chrono::_V2::steady_clock::now();
  iVar2 = -1;
  do {
    if (lVar7 == 65000) {
LAB_00102506:
      std::chrono::_V2::steady_clock::now();
      poVar5 = std::operator<<((ostream *)&std::cout,"Value at 0: ");
      poVar5 = std::operator<<(poVar5,(string *)stringPtrArray[0]);
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"Value at 1: ");
      poVar5 = std::operator<<(poVar5,(string *)stringPtrArray[1]);
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"Retrieved         : ");
      poVar5 = std::operator<<(poVar5,(string *)&chosenString);
      poVar5 = std::operator<<(poVar5," at index: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"Retrieval by name : Time difference = ");
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      poVar5 = std::operator<<(poVar5,"[ms]");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"Retrieval by name : Time difference = ");
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      poVar5 = std::operator<<(poVar5,anon_var_dwarf_50de);
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"Retrieval by name : Time difference = ");
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      poVar5 = std::operator<<(poVar5,"[ns]");
      std::endl<char,std::char_traits<char>>(poVar5);
      retrieved._M_dataplus._M_p = (pointer)&retrieved.field_2;
      retrieved._M_string_length = 0;
      retrieved.field_2._M_local_buf[0] = '\0';
      std::chrono::_V2::steady_clock::now();
      std::__cxx11::string::_M_assign((string *)&retrieved);
      std::chrono::_V2::steady_clock::now();
      poVar5 = std::operator<<((ostream *)&std::cout,"Retrieved         : ");
      poVar5 = std::operator<<(poVar5,(string *)&retrieved);
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"Retrieval by index: Time difference = ");
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      poVar5 = std::operator<<(poVar5,"[ms]");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"Retrieval by index: Time difference = ");
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      poVar5 = std::operator<<(poVar5,anon_var_dwarf_50de);
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"Retrieval by index: Time difference = ");
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      poVar5 = std::operator<<(poVar5,"[ns]");
      std::endl<char,std::char_traits<char>>(poVar5);
      keyValueStore._M_h._M_buckets = &keyValueStore._M_h._M_single_bucket;
      keyValueStore._M_h._M_bucket_count = 1;
      keyValueStore._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      keyValueStore._M_h._M_element_count = 0;
      keyValueStore._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      keyValueStore._M_h._M_rehash_policy._M_next_resize = 0;
      keyValueStore._M_h._M_single_bucket = (__node_base_ptr)0x0;
      key._M_dataplus._M_p = (pointer)&key.field_2;
      key._M_string_length = 0;
      key.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&randomValue,"wibble",(allocator<char> *)&retKey);
      std::chrono::_V2::steady_clock::now();
      for (iVar2 = 0; iVar2 != 65000; iVar2 = iVar2 + 1) {
        pcVar4 = (char *)operator_new__(0x21);
        for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 1) {
          iVar3 = rand();
          pcVar4[lVar7] = (char)(iVar3 % 0x1a) + 'a';
        }
        pcVar4[0x20] = '\0';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&retKey,pcVar4,(allocator<char> *)&retValue);
        std::__cxx11::string::operator=((string *)&key,(string *)&retKey);
        std::__cxx11::string::~string((string *)&retKey);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&retKey,&key,&randomValue);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&keyValueStore,
                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&retKey);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&retKey);
        if (iVar2 == 0xbe6f) {
          std::__cxx11::string::_M_assign((string *)&chosenString);
        }
      }
      std::chrono::_V2::steady_clock::now();
      poVar5 = std::operator<<((ostream *)&std::cout,"MapStore: Time difference = ");
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      poVar5 = std::operator<<(poVar5,"[ms]");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"MapStore: Time difference = ");
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      poVar5 = std::operator<<(poVar5,anon_var_dwarf_50de);
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"MapStore: Time difference = ");
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      poVar5 = std::operator<<(poVar5,"[ns]");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::chrono::_V2::steady_clock::now();
      iVar6 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&keyValueStore._M_h,&chosenString);
      std::__cxx11::string::string
                ((string *)&retKey,
                 (string *)
                 ((long)iVar6.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._M_cur + 8));
      std::__cxx11::string::string
                ((string *)&retValue,
                 (string *)
                 ((long)iVar6.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._M_cur + 0x28));
      std::chrono::_V2::steady_clock::now();
      poVar5 = std::operator<<((ostream *)&std::cout,"Retrieved key    : ");
      poVar5 = std::operator<<(poVar5,(string *)&retKey);
      poVar5 = std::operator<<(poVar5," with value: ");
      poVar5 = std::operator<<(poVar5,(string *)&retValue);
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"Retrieve from Map: Time difference = ");
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      poVar5 = std::operator<<(poVar5,"[ms]");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"Retrieve from Map: Time difference = ");
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      poVar5 = std::operator<<(poVar5,anon_var_dwarf_50de);
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"Retrieve from Map: Time difference = ");
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      poVar5 = std::operator<<(poVar5,"[ns]");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&retValue);
      std::__cxx11::string::~string((string *)&retKey);
      std::__cxx11::string::~string((string *)&randomValue);
      std::__cxx11::string::~string((string *)&key);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&keyValueStore._M_h);
      std::__cxx11::string::~string((string *)&retrieved);
      std::__cxx11::string::~string((string *)&chosenString);
      return 0;
    }
    _Var1 = std::operator==(&chosenString,stringPtrArray[lVar7]);
    if (_Var1) {
      iVar2 = (int)lVar7;
      goto LAB_00102506;
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

int main()
{
  // Store 65 000 items in memory of random length
  //  (max 16 letters @ 8 bits per char = 128 bits)
  //  (max 128 letters @ 8 bits per char = 1024 bits)
  // QUIZ: Why not 100 000 above?
  char* buffer;
  int bufferLength = 32;

  const int storeSize = 65000; // Number of records in our 'database'



  // OPTION 1: Store unsorted

  const unsigned short int chosen = (storeSize / 4) * 3 + 1;
  std::string chosenString;
  std::string* stringPtrArray[storeSize]; // array of pointers to strings
  int ci = 0;
  std::chrono::steady_clock::time_point begin = std::chrono::steady_clock::now();

  for (int idx = 0;idx < storeSize;idx++) {
    buffer = new char[bufferLength + 1]; // termination \0
    for (ci = 0;ci < bufferLength;ci++) {
      buffer[ci] = (rand() % 26) + 'a'; // random char from a-z
    }
    buffer[bufferLength] = '\0';
    stringPtrArray[idx] = new std::string(buffer);
    if (chosen == idx) {
      chosenString = *stringPtrArray[idx]; // copy constructor
    }
  }
  // Storage time?
  std::chrono::steady_clock::time_point end = std::chrono::steady_clock::now();

  std::cout << "Storage: Time difference = " << std::chrono::duration_cast<std::chrono::milliseconds>(end - begin).count() << "[ms]" << std::endl;
  std::cout << "Storage: Time difference = " << std::chrono::duration_cast<std::chrono::microseconds>(end - begin).count() << "[µs]" << std::endl;
  std::cout << "Storage: Time difference = " << std::chrono::duration_cast<std::chrono::nanoseconds> (end - begin).count() << "[ns]" << std::endl;
/*
Storage: Time difference = 34[ms]
Storage: Time difference = 34292[µs]
Storage: Time difference = 34292787[ns]
*/





  // OPTION 1a: Retrieve by key name

  // Pull back a random one by name (akin to a search by the key string in a K-V store)
  begin = std::chrono::steady_clock::now();
  int retrievedIdx = -1;
  for (int idx = 0;idx < storeSize;idx++) {
    if (chosenString == *stringPtrArray[idx]) {
      retrievedIdx = idx;
      break; // end loop early
    }
  }
  end = std::chrono::steady_clock::now();
  std::cout << "Value at 0: " << *stringPtrArray[0] << std::endl;
  std::cout << "Value at 1: " << *stringPtrArray[1] << std::endl;
  std::cout << "Retrieved         : " << chosenString << " at index: " << retrievedIdx << std::endl;
  std::cout << "Retrieval by name : Time difference = " << std::chrono::duration_cast<std::chrono::milliseconds>(end - begin).count() << "[ms]" << std::endl;
  std::cout << "Retrieval by name : Time difference = " << std::chrono::duration_cast<std::chrono::microseconds>(end - begin).count() << "[µs]" << std::endl;
  std::cout << "Retrieval by name : Time difference = " << std::chrono::duration_cast<std::chrono::nanoseconds> (end - begin).count() << "[ns]" << std::endl;
/*
Value at 0: lrfkqyuqfjkxyqvnrtysfrzrmzlygfve
Value at 1: ulqfpdbhlqdqrrcrwdnxeuoqqeklaitg
Retrieved         : oviwymmnaqptldgltxzaoofhohntvctq at index: 48751
Retrieval by name : Time difference = 4[ms]
Retrieval by name : Time difference = 4351[µs]
Retrieval by name : Time difference = 4351301[ns]
*/





  // OPTION 1b: Retrieve by known key index (position)

  // Pull back a random one by index, and record the time taken
  std::string retrieved;
  begin = std::chrono::steady_clock::now();
  retrieved = *stringPtrArray[chosen];
  end = std::chrono::steady_clock::now();
  std::cout << "Retrieved         : " << retrieved << std::endl;
  std::cout << "Retrieval by index: Time difference = " << std::chrono::duration_cast<std::chrono::milliseconds>(end - begin).count() << "[ms]" << std::endl;
  std::cout << "Retrieval by index: Time difference = " << std::chrono::duration_cast<std::chrono::microseconds>(end - begin).count() << "[µs]" << std::endl;
  std::cout << "Retrieval by index: Time difference = " << std::chrono::duration_cast<std::chrono::nanoseconds> (end - begin).count() << "[ns]" << std::endl;
/*
Retrieved         : oviwymmnaqptldgltxzaoofhohntvctq
Retrieval by index: Time difference = 0[ms]
Retrieval by index: Time difference = 0[µs]
Retrieval by index: Time difference = 935[ns]
*/








  // Solution formulation...

  // QUESTION: What is more performant: Fetch by name, or fetch by index?
  //   ANSWER: Index takes 1/263 of the time! It's *MUCH* faster!
  // QUESTION: If we hash the name and use this hash value as the index, could we improve things?
  //   ANSWER: Probably, yes
  //    QUESTION: Could the calculation of the hash take longer than retrieval of the value by name? What does this imply?
  //      ANSWER: Possibly, if not many keys or key names were all short. This means it will be slower than by name! ;o(









  // OPTION 2: Store by the hash of a key in an efficient (O log(n)) unordered map
  // C++11 reference https://www.cplusplus.com/reference/unordered_map/unordered_map/

  // Now do the same for a hash table variant
  // Hash table -> Convert type (string) to a hash number, store data at hash index, and retrieve by hash index
  // Use built in hash map type in C++ for this
  std::unordered_map<std::string,std::string> keyValueStore;
  std::string key;
  std::string randomValue = "wibble"; // doesn't matter - we're test key speed
  begin = std::chrono::steady_clock::now();
  for (int idx = 0;idx < storeSize;idx++) {
    buffer = new char[bufferLength + 1]; // termination \0
    for (ci = 0;ci < bufferLength;ci++) {
      buffer[ci] = (rand() % 26) + 'a'; // random char from a-z
    }
    buffer[bufferLength] = '\0';
    key = std::string(buffer);
    keyValueStore.insert({key,randomValue}); // C++11, creates a std::pair<string,string>
    if (chosen == idx) {
      chosenString = key; // copy constructor
    }
  }
  end = std::chrono::steady_clock::now();
  std::cout << "MapStore: Time difference = " << std::chrono::duration_cast<std::chrono::milliseconds>(end - begin).count() << "[ms]" << std::endl;
  std::cout << "MapStore: Time difference = " << std::chrono::duration_cast<std::chrono::microseconds>(end - begin).count() << "[µs]" << std::endl;
  std::cout << "MapStore: Time difference = " << std::chrono::duration_cast<std::chrono::nanoseconds> (end - begin).count() << "[ns]" << std::endl;
/*
MapStore: Time difference = 103[ms]
MapStore: Time difference = 103129[µs]
MapStore: Time difference = 103129217[ns]
*/





  // OPTION 2: Retrieval time
  begin = std::chrono::steady_clock::now();
  auto kvPair = keyValueStore.find(chosenString);
  std::string retKey = kvPair->first; // first is key
  std::string retValue = kvPair->second; // second is value
  end = std::chrono::steady_clock::now();
  std::cout << "Retrieved key    : " << retKey << " with value: " << retValue << std::endl;
  std::cout << "Retrieve from Map: Time difference = " << std::chrono::duration_cast<std::chrono::milliseconds>(end - begin).count() << "[ms]" << std::endl;
  std::cout << "Retrieve from Map: Time difference = " << std::chrono::duration_cast<std::chrono::microseconds>(end - begin).count() << "[µs]" << std::endl;
  std::cout << "Retrieve from Map: Time difference = " << std::chrono::duration_cast<std::chrono::nanoseconds> (end - begin).count() << "[ns]" << std::endl;
/*
Retrieved key    : yfuhybliokgniztyfuquvlaleaznpcsr with value: wibble
Retrieve from Map: Time difference = 0[ms]
Retrieve from Map: Time difference = 1[µs]
Retrieve from Map: Time difference = 1236[ns]
*/




  // CONCLUSIONS???

  // QUESTION: How did storage speeds compare amongst the two mechanisms?
  //   ANSWER: Hash method is 3 times slower! 103ms vs 34ms. "I thought you said this would be BETTER to use!?!" (well...)
  // QUESTION: How did retrieval speeds compare against the three mechanisms (fetch by name, by index (pre-computed hash), and by hash)?
  //   ANSWER: name: 4351301ns, index: 935ns, hash: 1249ns
  //           i.e. Retrieval was 1/3483 the time vs by name, but 1.33 times longer than a raw index
  //           BUT raw C++ in memory indexes are the quickest you're going to get - seek to memory location
  //            - You can't guarantee a large chunk of contiguous memory is given to your database server as
  //              most Operating Systems randomise memory locations for security, so you can't use raw memory.
  //           CONCLUSION: Hash based map implementations are insanely quick - we should totally use hashes and in-memory unordered maps
}